

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::LoopConstraint::calcGamma
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,MatrixNd *GSys,
          VectorNd *gammaSysUpd,ConstraintCache *cache,bool updateKinematics)

{
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *a;
  ResScalar RVar1;
  ResScalar RVar2;
  long lVar3;
  uint i;
  ulong uVar4;
  SpatialVector local_98;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_48;
  
  CalcBodyToBaseCoordinates
            ((Vector3d *)&local_98,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(double *)(cache + 0x4c8) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  *(double *)(cache + 0x4b8) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  *(double *)(cache + 0x4c0) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  CalcBodyWorldOrientation
            ((Matrix3d *)&local_98,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,updateKinematics);
  local_48.m_rhs =
       (RhsNested)
       (this->super_Constraint).bodyFrames.
       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
       .
       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.m_lhs.m_matrix = (non_const_type)&local_98;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)(cache + 0x470),&local_48);
  CalcPointVelocity6D(&local_98,model,Q,QDot,
                      *(this->super_Constraint).bodyIds.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                      &((this->super_Constraint).bodyFrames.
                        super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        .
                        super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(double *)(cache + 0x370) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  *(double *)(cache + 0x378) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  *(double *)(cache + 0x360) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  *(double *)(cache + 0x368) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  *(double *)(cache + 0x350) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  *(double *)(cache + 0x358) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  CalcPointVelocity6D(&local_98,model,Q,QDot,
                      (this->super_Constraint).bodyIds.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[1],
                      &(this->super_Constraint).bodyFrames.
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].r,updateKinematics);
  *(double *)(cache + 0x3a0) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  *(double *)(cache + 0x3a8) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  *(double *)(cache + 0x390) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  *(double *)(cache + 0x398) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  *(double *)(cache + 0x380) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  *(double *)(cache + 0x388) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  CalcPointAcceleration6D
            (&local_98,model,Q,QDot,(VectorNd *)cache,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(double *)(cache + 0x3d0) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  *(double *)(cache + 0x3d8) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  *(double *)(cache + 0x3c0) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  *(double *)(cache + 0x3c8) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  *(double *)(cache + 0x3b0) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  *(double *)(cache + 0x3b8) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  CalcPointAcceleration6D
            (&local_98,model,Q,QDot,(VectorNd *)cache,
             (this->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],
             &(this->super_Constraint).bodyFrames.
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              .
              super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ._M_impl.super__Vector_impl_data._M_start[1].r,updateKinematics);
  *(double *)(cache + 0x400) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  *(double *)(cache + 0x408) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  *(double *)(cache + 0x3f0) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  *(double *)(cache + 0x3f8) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  *(double *)(cache + 0x3e0) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  *(double *)(cache + 1000) =
       local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  a = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(cache + 0x410);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < (this->super_Constraint).sizeOfConstraint; uVar4 = uVar4 + 1) {
    Math::SpatialTransform::apply
              ((SpatialTransform *)(cache + 0x470),
               (SpatialVector *)(*(long *)&(this->super_Constraint).field_0xd8 + lVar3));
    *(double *)(cache + 0x430) =
         local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    *(double *)(cache + 0x438) =
         local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    *(double *)(cache + 0x420) =
         local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    *(double *)(cache + 0x428) =
         local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    *(double *)a = local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0];
    *(double *)(cache + 0x418) =
         local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    Math::crossm((SpatialVector *)(cache + 0x350),(SpatialVector *)a);
    *(double *)(cache + 0x460) =
         local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    *(double *)(cache + 0x468) =
         local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    *(double *)(cache + 0x450) =
         local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    *(double *)(cache + 0x458) =
         local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    *(double *)(cache + 0x440) =
         local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    *(double *)(cache + 0x448) =
         local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         (double)(cache + 0x3e0);
    local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         (double)(cache + 0x3b0);
    RVar1 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_false>
            ::run(a,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                     *)&local_98);
    local_48.m_lhs.m_matrix = (non_const_type)(cache + 0x380);
    local_48.m_rhs = (RhsNested)(cache + 0x350);
    RVar2 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_false>
            ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(cache + 0x440),
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                   *)&local_48);
    (gammaSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    [(this->super_Constraint).rowInSystem + (int)uVar4] = -RVar1 - RVar2;
    lVar3 = lVar3 + 0x30;
  }
  return;
}

Assistant:

void LoopConstraint::calcGamma(  Model &model,
                  const double time,
                  const Math::VectorNd &Q,
                  const Math::VectorNd &QDot,
                  const Math::MatrixNd &GSys,
                  Math::VectorNd &gammaSysUpd,
                  ConstraintCache &cache,
                  bool updateKinematics)
{
  //Please refer to Ch. 8 of Featherstone's Rigid Body Dynamics text for details

  // Express the constraint axis in the base frame.
  cache.stA.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics);
  cache.stA.E = CalcBodyWorldOrientation(model,Q,bodyIds[0],updateKinematics
                                         ).transpose()*bodyFrames[0].E;

  // Compute the spatial velocities of the two constrained bodies.
  //vel_p
  cache.svecA = CalcPointVelocity6D(model,Q,QDot,bodyIds[0],bodyFrames[0].r,
                                    updateKinematics);

  //vel_s
  cache.svecB = CalcPointVelocity6D(model,Q,QDot,bodyIds[1],bodyFrames[1].r,
                                    updateKinematics);

  // Compute the velocity product accelerations. These correspond to the
  // accelerations that the bodies would have if q ddot were 0. If this
  // confuses you please see Sec. 8.2 of Featherstone's Rigid Body Dynamics text

  //acc_p
  cache.svecC = CalcPointAcceleration6D(model,Q,QDot,cache.vecNZeros,
                                        bodyIds[0],bodyFrames[0].r,updateKinematics);
  //acc_s
  cache.svecD = CalcPointAcceleration6D(model,Q,QDot,cache.vecNZeros,
                                        bodyIds[1],bodyFrames[1].r,updateKinematics);

  for(unsigned int i=0; i<sizeOfConstraint;++i){

    cache.svecE = cache.stA.apply(T[i]);

    cache.svecF = crossm(cache.svecA, cache.svecE);

    gammaSysUpd[rowInSystem+i] =
        -cache.svecE.dot(cache.svecD-cache.svecC)
        -cache.svecF.dot(cache.svecB-cache.svecA);
  }

}